

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  ulong uVar5;
  SelectionVector *pSVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  idx_t local_68;
  long local_60;
  idx_t local_38;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        local_60 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        local_60 = 0;
        uVar9 = 0;
        do {
          uVar5 = uVar9;
          if (psVar1 != (sel_t *)0x0) {
            uVar5 = (ulong)psVar1[uVar9];
          }
          uVar7 = uVar9;
          if (psVar2 != (sel_t *)0x0) {
            uVar7 = (ulong)psVar2[uVar9];
          }
          uVar10 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar3[uVar9];
          }
          lVar11 = (long)ldata[uVar7].days + ldata[uVar7].micros / 86400000000;
          lVar12 = lVar11 % 0x1e;
          lVar13 = (long)ldata[uVar7].months + lVar11 / 0x1e;
          lVar8 = (long)rdata[uVar10].days + rdata[uVar10].micros / 86400000000;
          lVar11 = lVar8 % 0x1e;
          lVar8 = (long)rdata[uVar10].months + lVar8 / 0x1e;
          if ((lVar13 <= lVar8) &&
             ((lVar13 < lVar8 ||
              ((lVar12 <= lVar11 &&
               ((lVar12 < lVar11 ||
                (ldata[uVar7].micros % 86400000000 <= rdata[uVar10].micros % 86400000000)))))))) {
            false_sel->sel_vector[local_60] = (sel_t)uVar5;
            local_60 = local_60 + 1;
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
      return count - local_60;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      local_68 = 0;
      uVar9 = 0;
      do {
        uVar5 = uVar9;
        if (psVar1 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar1[uVar9];
        }
        uVar7 = uVar9;
        if (psVar2 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar2[uVar9];
        }
        uVar10 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar3[uVar9];
        }
        lVar11 = (long)ldata[uVar7].days + ldata[uVar7].micros / 86400000000;
        lVar12 = lVar11 % 0x1e;
        lVar13 = (long)ldata[uVar7].months + lVar11 / 0x1e;
        lVar8 = (long)rdata[uVar10].days + rdata[uVar10].micros / 86400000000;
        lVar11 = lVar8 % 0x1e;
        lVar8 = (long)rdata[uVar10].months + lVar8 / 0x1e;
        if ((lVar8 < lVar13) ||
           ((lVar8 <= lVar13 &&
            ((lVar11 < lVar12 ||
             ((lVar11 <= lVar12 &&
              (rdata[uVar10].micros % 86400000000 < ldata[uVar7].micros % 86400000000)))))))) {
          true_sel->sel_vector[local_68] = (sel_t)uVar5;
          local_68 = local_68 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
      return local_68;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_68 = 0;
    local_38 = 0;
    uVar9 = 0;
    do {
      uVar5 = uVar9;
      if (psVar1 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar1[uVar9];
      }
      uVar7 = uVar9;
      if (psVar2 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar2[uVar9];
      }
      uVar10 = uVar9;
      if (psVar3 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar3[uVar9];
      }
      lVar11 = (long)ldata[uVar7].days + ldata[uVar7].micros / 86400000000;
      lVar13 = lVar11 % 0x1e;
      lVar8 = (long)ldata[uVar7].months + lVar11 / 0x1e;
      lVar12 = (long)rdata[uVar10].days + rdata[uVar10].micros / 86400000000;
      lVar11 = lVar12 % 0x1e;
      lVar12 = (long)rdata[uVar10].months + lVar12 / 0x1e;
      if ((lVar12 < lVar8) ||
         ((lVar12 <= lVar8 &&
          ((lVar11 < lVar13 ||
           ((lVar11 <= lVar13 &&
            (rdata[uVar10].micros % 86400000000 < ldata[uVar7].micros % 86400000000)))))))) {
        iVar4 = local_68;
        pSVar6 = true_sel;
        local_68 = local_68 + 1;
      }
      else {
        iVar4 = local_38;
        pSVar6 = false_sel;
        local_38 = local_38 + 1;
      }
      pSVar6->sel_vector[iVar4] = (sel_t)uVar5;
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
    return local_68;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}